

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void QCss::Scanner::scan(QString *preprocessedInput,QList<QCss::Symbol> *symbols)

{
  int iVar1;
  QCssScanner_Generated *in_RSI;
  long in_FS_OFFSET;
  int tok;
  Symbol sym;
  QCssScanner_Generated scanner;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffa4;
  QString QStack_58;
  undefined4 local_40;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0,0x30);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QCssScanner_Generated::QCssScanner_Generated
            (in_RSI,(QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  memset(&stack0xffffffffffffffa0,0xaa,0x28);
  Symbol::Symbol((Symbol *)in_RSI);
  iVar1 = QCssScanner_Generated::lex
                    ((QCssScanner_Generated *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  while (iVar1 != -1) {
    iVar2 = iVar1;
    QString::operator=(&QStack_58,(QString *)&local_38);
    local_40 = SUB84(local_18,0);
    local_3c = SUB84(local_10,0);
    QList<QCss::Symbol>::append
              ((QList<QCss::Symbol> *)in_RSI,
               (parameter_type)CONCAT44(iVar1,in_stack_ffffffffffffff88));
    iVar1 = QCssScanner_Generated::lex
                      ((QCssScanner_Generated *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
  }
  Symbol::~Symbol((Symbol *)0xa39ba3);
  QCssScanner_Generated::~QCssScanner_Generated((QCssScanner_Generated *)0xa39bad);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Scanner::scan(const QString &preprocessedInput, QList<Symbol> *symbols)
{
    QCssScanner_Generated scanner(preprocessedInput);
    Symbol sym;
    int tok = scanner.lex();
    while (tok != -1) {
        sym.token = static_cast<QCss::TokenType>(tok);
        sym.text = scanner.input;
        sym.start = scanner.lexemStart;
        sym.len = scanner.lexemLength;
        symbols->append(sym);
        tok = scanner.lex();
    }
}